

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall leveldb::log::_Test_UnexpectedFullType::_Run(_Test_UnexpectedFullType *this)

{
  allocator local_781;
  string local_780 [32];
  undefined1 local_760 [448];
  size_t local_5a0;
  int local_594;
  Tester local_590;
  undefined1 local_3f0 [448];
  undefined1 local_230 [455];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  _Test_UnexpectedFullType *local_10;
  _Test_UnexpectedFullType *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"foo",&local_31);
  LogTest::Write(&this->super_LogTest,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"bar",&local_69);
  LogTest::Write(&this->super_LogTest,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  LogTest::SetByte(&this->super_LogTest,6,'\x02');
  LogTest::FixChecksum(&this->super_LogTest,0,3);
  test::Tester::Tester
            ((Tester *)(local_230 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x1bb);
  LogTest::Read_abi_cxx11_((LogTest *)local_230);
  test::Tester::IsEq<char[4],std::__cxx11::string>
            ((Tester *)(local_230 + 0x20),(char (*) [4])"bar",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
  std::__cxx11::string::~string((string *)local_230);
  test::Tester::~Tester((Tester *)(local_230 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_3f0 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x1bc);
  LogTest::Read_abi_cxx11_((LogTest *)local_3f0);
  test::Tester::IsEq<char[4],std::__cxx11::string>
            ((Tester *)(local_3f0 + 0x20),(char (*) [4])"EOF",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0);
  std::__cxx11::string::~string((string *)local_3f0);
  test::Tester::~Tester((Tester *)(local_3f0 + 0x20));
  test::Tester::Tester
            (&local_590,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x1bd);
  local_594 = 3;
  local_5a0 = LogTest::DroppedBytes(&this->super_LogTest);
  test::Tester::IsEq<int,unsigned_long>(&local_590,&local_594,&local_5a0);
  test::Tester::~Tester(&local_590);
  test::Tester::Tester
            ((Tester *)(local_760 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x1be);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_780,"partial record without end",&local_781);
  LogTest::MatchError((LogTest *)local_760,(string *)this);
  test::Tester::IsEq<char[3],std::__cxx11::string>
            ((Tester *)(local_760 + 0x20),(char (*) [3])"OK",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_760);
  std::__cxx11::string::~string((string *)local_760);
  std::__cxx11::string::~string(local_780);
  std::allocator<char>::~allocator((allocator<char> *)&local_781);
  test::Tester::~Tester((Tester *)(local_760 + 0x20));
  return;
}

Assistant:

TEST(LogTest, UnexpectedFullType) {
  Write("foo");
  Write("bar");
  SetByte(6, kFirstType);
  FixChecksum(0, 3);
  ASSERT_EQ("bar", Read());
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(3, DroppedBytes());
  ASSERT_EQ("OK", MatchError("partial record without end"));
}